

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.h
# Opt level: O1

void __thiscall
QRhiShaderResourceBindings::~QRhiShaderResourceBindings(QRhiShaderResourceBindings *this)

{
  Data *pDVar1;
  undefined1 *puVar2;
  
  (this->super_QRhiResource)._vptr_QRhiResource =
       (_func_int **)&PTR__QRhiShaderResourceBindings_007ec0f0;
  pDVar1 = (this->m_layoutDesc).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_layoutDesc).d.d)->super_QArrayData,4,0x10);
    }
  }
  puVar2 = (undefined1 *)
           (this->m_bindings).super_QVLABase<QRhiShaderResourceBinding>.super_QVLABaseBase.ptr;
  if ((QVLAStorage<280UL,_8UL,_12LL> *)puVar2 !=
      &(this->m_bindings).super_QVLAStorage<280UL,_8UL,_12LL>) {
    QtPrivate::sizedFree
              (puVar2,(this->m_bindings).super_QVLABase<QRhiShaderResourceBinding>.
                      super_QVLABaseBase.a * 0x118);
  }
  QRhiResource::~QRhiResource(&this->super_QRhiResource);
  return;
}

Assistant:

class Q_GUI_EXPORT QRhiShaderResourceBindings : public QRhiResource
{
public:
    QRhiResource::Type resourceType() const override;

    void setBindings(std::initializer_list<QRhiShaderResourceBinding> list) { m_bindings = list; }
    template<typename InputIterator>
    void setBindings(InputIterator first, InputIterator last)
    {
        m_bindings.clear();
        std::copy(first, last, std::back_inserter(m_bindings));
    }
    const QRhiShaderResourceBinding *cbeginBindings() const { return m_bindings.cbegin(); }
    const QRhiShaderResourceBinding *cendBindings() const { return m_bindings.cend(); }
    const QRhiShaderResourceBinding *bindingAt(qsizetype index) const { return &m_bindings.at(index); }
    qsizetype bindingCount() const { return m_bindings.count(); }

    bool isLayoutCompatible(const QRhiShaderResourceBindings *other) const;

    QVector<quint32> serializedLayoutDescription() const { return m_layoutDesc; }

    virtual bool create() = 0;

    enum UpdateFlag {
        BindingsAreSorted = 0x01
    };
    Q_DECLARE_FLAGS(UpdateFlags, UpdateFlag)

    virtual void updateResources(UpdateFlags flags = {}) = 0;

protected:
    static constexpr int BINDING_PREALLOC = 12;
    QRhiShaderResourceBindings(QRhiImplementation *rhi);
    QVarLengthArray<QRhiShaderResourceBinding, BINDING_PREALLOC> m_bindings;
    size_t m_layoutDescHash = 0;
    // Intentionally not using QVLA for m_layoutDesc: clients like Qt Quick are much
    // better served with an implicitly shared container here, because they will likely
    // throw this directly into structs serving as cache keys.
    QVector<quint32> m_layoutDesc;
    friend class QRhiImplementation;
#ifndef QT_NO_DEBUG_STREAM
    friend Q_GUI_EXPORT QDebug operator<<(QDebug, const QRhiShaderResourceBindings &);
#endif
}